

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::ShapeSample> * __thiscall
pbrt::Cylinder::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Cylinder *this,
          ShapeSampleContext *ctx,Point2f u)

{
  ShapeSample *pSVar1;
  Point3<float> *p2;
  type tVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 extraout_var [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  Point3f PVar12;
  Point3f PVar13;
  Vector3<float> VVar14;
  optional<pbrt::ShapeSample> ss;
  Vector3<float> local_c8;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  float local_a0;
  optional<pbrt::ShapeSample> local_98;
  Tuple3<pbrt::Point3,_float> local_38;
  Tuple3<pbrt::Vector3,_float> local_28;
  undefined1 auVar11 [56];
  
  Sample(&local_98,this,u);
  local_b8._0_4_ = ctx->time;
  pSVar1 = pstd::optional<pbrt::ShapeSample>::value(&local_98);
  auVar11 = (undefined1  [56])0x0;
  (pSVar1->intr).time = (Float)local_b8._0_4_;
  pSVar1 = pstd::optional<pbrt::ShapeSample>::value(&local_98);
  PVar12 = Interaction::p(&pSVar1->intr);
  auVar6._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar11;
  local_b8 = auVar6._0_16_;
  PVar13 = ShapeSampleContext::p(ctx);
  auVar7._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar11;
  auVar5 = vsubps_avx(local_b8,auVar7._0_16_);
  local_c8.super_Tuple3<pbrt::Vector3,_float>.z =
       PVar12.super_Tuple3<pbrt::Point3,_float>.z - PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  local_c8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar5);
  auVar4._0_4_ = auVar5._0_4_ * auVar5._0_4_;
  auVar4._4_4_ = auVar5._4_4_ * auVar5._4_4_;
  auVar4._8_4_ = auVar5._8_4_ * auVar5._8_4_;
  auVar4._12_4_ = auVar5._12_4_ * auVar5._12_4_;
  auVar5 = vhaddps_avx(auVar4,auVar4);
  fVar3 = local_c8.super_Tuple3<pbrt::Vector3,_float>.z *
          local_c8.super_Tuple3<pbrt::Vector3,_float>.z + auVar5._0_4_;
  auVar11 = (undefined1  [56])0x0;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    VVar14 = Normalize<float>(&local_c8);
    local_c8.super_Tuple3<pbrt::Vector3,_float>.z = VVar14.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar8._0_8_ = VVar14.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar11;
    local_c8.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar8._0_16_);
    pSVar1 = pstd::optional<pbrt::ShapeSample>::value(&local_98);
    auVar5._0_8_ = local_c8.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    auVar5._8_4_ = 0x80000000;
    auVar5._12_4_ = 0x80000000;
    local_28.z = -local_c8.super_Tuple3<pbrt::Vector3,_float>.z;
    local_28._0_8_ = vmovlps_avx(auVar5);
    tVar2 = AbsDot<float>(&(pSVar1->intr).n,(Vector3<float> *)&local_28);
    local_b8._0_4_ = tVar2;
    auVar11 = extraout_var;
    PVar12 = ShapeSampleContext::p(ctx);
    local_a0 = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
    auVar9._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar9._8_56_ = auVar11;
    local_a8 = vmovlps_avx(auVar9._0_16_);
    pSVar1 = pstd::optional<pbrt::ShapeSample>::value(&local_98);
    PVar12 = Interaction::p(&pSVar1->intr);
    local_38.z = PVar12.super_Tuple3<pbrt::Point3,_float>.z;
    auVar10._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar10._8_56_ = auVar11;
    local_38._0_8_ = vmovlps_avx(auVar10._0_16_);
    fVar3 = DistanceSquared<float>((pbrt *)&local_a8,(Point3<float> *)&local_38,p2);
    pSVar1 = pstd::optional<pbrt::ShapeSample>::value(&local_98);
    pSVar1->pdf = pSVar1->pdf / ((float)local_b8._0_4_ / fVar3);
    pSVar1 = pstd::optional<pbrt::ShapeSample>::value(&local_98);
    if (ABS(pSVar1->pdf) != INFINITY) {
      pstd::optional<pbrt::ShapeSample>::optional(__return_storage_ptr__,&local_98);
      goto LAB_00302953;
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
LAB_00302953:
  pstd::optional<pbrt::ShapeSample>::~optional(&local_98);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Uniformly sample shape and compute incident direction _wi_
        pstd::optional<ShapeSample> ss = Sample(u);
        DCHECK(ss.has_value());
        ss->intr.time = ctx.time;
        Vector3f wi = ss->intr.p() - ctx.p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);

        // Convert uniform area sample PDF in _ss_ to solid angle measure
        ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
        if (IsInf(ss->pdf))
            return {};

        return ss;
    }